

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

lbool __thiscall Minisat::Solver::solve_(Solver *this)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  lbool lVar4;
  int iVar5;
  int iVar6;
  uint64_t uVar7;
  long lVar8;
  undefined8 *puVar9;
  ulong uVar10;
  uint uVar11;
  char *__s;
  ulong uVar12;
  int pre_conflict_size;
  uint uVar13;
  double dVar14;
  double dVar15;
  rusage ru;
  rusage local_c0;
  
  if ((this->model).data != (lbool *)0x0) {
    (this->model).sz = 0;
  }
  if ((this->conflict).data != (Lit *)0x0) {
    (this->conflict).sz = 0;
  }
  if (this->ok != true) {
    return (lbool)'\x01';
  }
  reset_old_trail(this);
  this->solves = this->solves + 1;
  this->solve_starts = (int)this->starts;
  getrusage(RUSAGE_SELF,&local_c0);
  lVar2 = CONCAT44(local_c0.ru_utime.tv_sec._4_4_,(int)local_c0.ru_utime.tv_sec);
  dVar14 = (double)local_c0.ru_utime.tv_usec;
  this->systematic_branching_state = 1;
  this->max_learnts = (double)(this->clauses).sz * this->learntsize_factor;
  this->learntsize_adjust_confl = (double)this->learntsize_adjust_start_confl;
  this->learntsize_adjust_cnt = this->learntsize_adjust_start_confl;
  std::vector<char,_std::allocator<char>_>::resize
            (&this->ls_mediation_soln,(long)(this->vardata).sz);
  std::vector<char,_std::allocator<char>_>::resize(&this->ls_best_soln,(long)(this->vardata).sz);
  std::vector<char,_std::allocator<char>_>::resize(&this->top_trail_soln,(long)(this->vardata).sz);
  if (0 < this->verbosity) {
    puts("c ============================[ Search Statistics ]==============================");
    puts("c | Conflicts |          ORIGINAL         |          LEARNT          | Progress |");
    puts("c |           |    Vars  Clauses Literals |    Limit  Clauses Lit/Cl |          |");
    puts("c ===============================================================================");
  }
  if ((this->add_tmp).data != (Lit *)0x0) {
    (this->add_tmp).sz = 0;
  }
  iVar5 = (this->assumptions).sz;
  if (0 < iVar5) {
    this->solved_by_ls = false;
  }
  if (((this->sls_var_lim != -1) && (this->sls_var_lim < (this->vardata).sz)) ||
     ((this->sls_clause_lim != -1 && (this->sls_clause_lim < (this->clauses).sz)))) {
    this->use_ccnr = false;
  }
  uVar7 = this->solves;
  lVar4.value = 2;
  if (uVar7 == 1 && iVar5 == 0) {
    if (this->initial_sls == true) {
      bVar3 = call_ls(this,false);
      lVar4.value = !bVar3 * '\x02';
      uVar7 = this->solves;
      goto LAB_0011b61b;
    }
LAB_0011b621:
    if (VSIDS_DISTANCE < this->current_heuristic) {
      toggle_decision_heuristic(this,true);
    }
    local_c0.ru_utime.tv_sec._0_4_ = (int)this->VSIDS_props_init_limit;
    if (((0 < (int)local_c0.ru_utime.tv_sec & lVar4.value >> 1) == 1) &&
       (lVar4.value = 2, this->asynch_interrupt == false)) {
      while (((this->conflict_budget < 0 || (this->conflicts < (ulong)this->conflict_budget)) &&
             ((this->propagation_budget < 0 ||
              (this->propagations < (ulong)this->propagation_budget))))) {
        if ((((this->termCallback != (_func_int_void_ptr *)0x0) &&
             (iVar5 = (*this->termCallback)(this->termCallbackState), iVar5 != 0)) ||
            (lVar4 = search(this,(int *)&local_c0), (lVar4.value & 2) == 0)) ||
           (((int)local_c0.ru_utime.tv_sec < 1 || (this->asynch_interrupt != false)))) break;
      }
    }
    toggle_decision_heuristic(this,false);
  }
  else {
LAB_0011b61b:
    if (uVar7 == 1) goto LAB_0011b621;
  }
  this->last_switch_conflicts = (int)this->starts;
  if (((lVar4.value & 2) != 0) && (this->asynch_interrupt == false)) {
    uVar13 = 0;
    uVar12 = 0;
    do {
      if (((-1 < this->conflict_budget) && ((ulong)this->conflict_budget <= this->conflicts)) ||
         (uVar10 = this->propagations,
         (ulong)this->propagation_budget <= uVar10 && -1 < this->propagation_budget)) break;
      if (this->termCallback != (_func_int_void_ptr *)0x0) {
        iVar5 = (*this->termCallback)(this->termCallbackState);
        if (iVar5 != 0) break;
        uVar10 = this->propagations;
      }
      uVar1 = this->VSIDS_props_limit;
      if (uVar1 < uVar10 - uVar12) {
        this->switch_mode = true;
        this->VSIDS_props_limit = uVar1 / 10 + uVar1;
        uVar12 = uVar10;
      }
      if (this->current_heuristic < CHB) {
        local_c0.ru_utime.tv_sec._0_4_ = 0x7fffffff;
      }
      else {
        if ((int)uVar13 < 1) {
          uVar11 = 0;
          iVar5 = 0;
        }
        else {
          iVar6 = 1;
          iVar5 = 0;
          do {
            iVar5 = iVar5 + 1;
            uVar11 = iVar6 * 2;
            iVar6 = iVar6 * 2 + 1;
          } while ((int)uVar11 < (int)uVar13);
        }
        uVar10 = (ulong)uVar13;
        if (uVar11 != uVar13) {
          do {
            iVar5 = iVar5 + -1;
            uVar1 = (long)(int)uVar10 % (long)((int)uVar11 >> 1);
            uVar10 = uVar1 & 0xffffffff;
            uVar11 = ((int)uVar11 >> 1) - 1;
          } while (uVar11 != (uint)uVar1);
        }
        dVar15 = pow(this->restart_inc,(double)iVar5);
        local_c0.ru_utime.tv_sec._0_4_ = (int)((double)this->restart_first * dVar15);
        uVar13 = uVar13 + 1;
      }
      lVar4 = search(this,(int *)&local_c0);
      if (this->switch_heristic_mod < this->starts - (long)this->last_switch_conflicts) {
        this->switch_mode = false;
        toggle_decision_heuristic(this,VSIDS_DISTANCE < this->current_heuristic);
        if (1 < this->verbosity) {
          __s = "c Switched to LRB/DISTANCE.";
          if (this->current_heuristic < CHB) {
            __s = "c Switched to VSIDS.";
          }
          puts(__s);
        }
      }
      if (((lVar4.value & 2) == 0) || (this->asynch_interrupt != false)) break;
    } while( true );
  }
  if (0 < this->verbosity) {
    puts("c ===============================================================================");
  }
  if (lVar4.value == 1 && (FILE *)this->drup_file != (FILE *)0x0) {
    fwrite_unlocked(drup_buf,1,(long)this->buf_len,(FILE *)this->drup_file);
    this->buf_ptr = drup_buf;
    this->buf_len = 0;
  }
  else if (lVar4.value != 1) {
    if (lVar4.value == 0) {
      vec<Minisat::lbool>::growTo(&this->model,(this->vardata).sz);
      iVar5 = (this->vardata).sz;
      if (this->solved_by_ls == false) {
        if (0 < iVar5) {
          lVar8 = 0;
          do {
            (this->model).data[lVar8].value = (this->assigns).data[lVar8].value;
            lVar8 = lVar8 + 1;
          } while (lVar8 < (this->vardata).sz);
        }
      }
      else if (0 < iVar5) {
        lVar8 = 0;
        do {
          (this->model).data[lVar8].value =
               (this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8] == '\0';
          lVar8 = lVar8 + 1;
        } while (lVar8 < (this->vardata).sz);
      }
      if ((this->check_satisfiability == true) && (this->check_satisfiability_simplified == false))
      {
        bVar3 = SATchecker::checkModel(&this->satChecker,&this->model);
        if (!bVar3) {
          puVar9 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar9 = "ERROR: detected model that does not satisfy input formula, abort";
          __cxa_throw(puVar9,&char_const*::typeinfo,0);
        }
        if (this->verbosity != 0) {
          puts("c validated SAT answer");
        }
      }
    }
    cancelUntil(this,0,false);
    goto LAB_0011ba40;
  }
  if ((this->conflict).sz == 0) {
    this->ok = false;
  }
  cancelUntil(this,0,false);
  iVar5 = (this->conflict).sz;
  if ((iVar5 != 0) && (this->lcm_core == true)) {
    if (this->lcm_core_success == true) {
      simplifyLearnt<Minisat::vec<Minisat::Lit>>(this,&this->conflict);
      this->lcm_core_success = (this->conflict).sz < iVar5;
    }
    else {
      this->lcm_core_success = true;
    }
  }
LAB_0011ba40:
  this->systematic_branching_state = 0;
  getrusage(RUSAGE_SELF,&local_c0);
  (this->statistics).solveSeconds =
       (((double)local_c0.ru_utime.tv_usec / 1000000.0 +
        (double)CONCAT44(local_c0.ru_utime.tv_sec._4_4_,(int)local_c0.ru_utime.tv_sec)) -
       (dVar14 / 1000000.0 + (double)lVar2)) + (this->statistics).solveSeconds;
  return (lbool)lVar4.value;
}

Assistant:

lbool Solver::solve_()
{
    model.clear();
    conflict.clear();
    if (!ok) return l_False;

    reset_old_trail();
    solves++;
    solve_starts = starts;
    TRACE(std::cout << "c start " << solves << " solve call with " << clauses.size() << " clauses and " << nVars()
                    << " variables" << std::endl);

    double solve_start = cpuTime();
    systematic_branching_state = 1;

    max_learnts = nClauses() * learntsize_factor;
    learntsize_adjust_confl = learntsize_adjust_start_confl;
    learntsize_adjust_cnt = (int)learntsize_adjust_confl;
    lbool status = l_Undef;

    ls_mediation_soln.resize(nVars());
    ls_best_soln.resize(nVars());
    top_trail_soln.resize(nVars());

    if (verbosity >= 1) {
        printf("c ============================[ Search Statistics ]==============================\n");
        printf("c | Conflicts |          ORIGINAL         |          LEARNT          | Progress |\n");
        printf("c |           |    Vars  Clauses Literals |    Limit  Clauses Lit/Cl |          |\n");
        printf("c ===============================================================================\n");
    }

    add_tmp.clear();

    /* disable a potential SLS solution in case of solving with assumptions */
    if (assumptions.size() > 0) solved_by_ls = false;

    /* allow to disable SLS for larger clauses */
    if ((sls_var_lim != -1 && nVars() > sls_var_lim) || (sls_clause_lim != -1 && nClauses() > sls_clause_lim)) {
        use_ccnr = false;
    }

    /* do not start with SLS, in case we have assumptions, or solve incrementally */
    if (assumptions.size() == 0 && solves == 1 && initial_sls) {
        int fls_res = call_ls(false);
        if (fls_res) {
            status = l_True;
        }
    }

    // toggle back to VSIDS, in case we run the initialization here
    if (solves == 1) {
        if (!usesVSIDS()) toggle_decision_heuristic(true);
        int init = VSIDS_props_init_limit;
        while (status == l_Undef && init > 0 && withinBudget()) status = search(init);
        // do not use VSIDS now
        toggle_decision_heuristic(false);
    }

    // Search:
    uint64_t curr_props = 0;
    int curr_restarts = 0;
    last_switch_conflicts = starts;
    while (status == l_Undef && withinBudget()) {
        if (propagations - curr_props > VSIDS_props_limit) {
            curr_props = propagations;
            switch_mode = true;
            VSIDS_props_limit = VSIDS_props_limit + VSIDS_props_limit / 10;
        }
        if (usesVSIDS()) {
            int weighted = INT32_MAX;
            status = search(weighted);
        } else {
            int nof_conflicts = luby(restart_inc, curr_restarts) * restart_first;
            curr_restarts++;
            status = search(nof_conflicts);
        }

        // toggle VSIDS?
        // if (switch_mode) {
        if (starts - last_switch_conflicts > switch_heristic_mod) {
            switch_mode = false;
            toggle_decision_heuristic(!usesVSIDS()); // switch to VSIDS
            if (verbosity >= 1) {
                if (usesVSIDS()) {
                    if (verbosity > 1) printf("c Switched to VSIDS.\n");
                } else {
                    if (verbosity > 1) printf("c Switched to LRB/DISTANCE.\n");
                }
            }
        }
    }

    TRACE(check_invariants();)

    if (verbosity >= 1) printf("c ===============================================================================\n");

#ifdef BIN_DRUP
    if (drup_file && status == l_False) binDRUP_flush(drup_file);
#endif

    if (status == l_True) {
        // Extend & copy model:
        model.growTo(nVars());
        if (solved_by_ls)
            for (int i = 0; i < nVars(); i++) model[i] = ls_mediation_soln[i] ? l_True : l_False;
        else
            for (int i = 0; i < nVars(); i++) model[i] = value(i);

        if (check_satisfiability && !check_satisfiability_simplified) {
            if (!satChecker.checkModel(model)) {
                assert(false && "model should satisfy full input formula");
                throw("ERROR: detected model that does not satisfy input formula, abort");
                exit(1);
            } else if (verbosity)
                printf("c validated SAT answer\n");
        }

    } else if (status == l_False && conflict.size() == 0)
        ok = false;

    cancelUntil(0);

    if (status == l_False && conflict.size() && lcm_core) {
        if (lcm_core_success) {
            int pre_conflict_size = conflict.size();
            simplifyLearnt(conflict);
            lcm_core_success = pre_conflict_size > conflict.size();
        } else
            lcm_core_success = true;
    }

    systematic_branching_state = 0;
    statistics.solveSeconds += cpuTime() - solve_start; // stop timer and record time consumed until now

    return status;
}